

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O0

pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> * __thiscall
Algorithms::discreteSquareRoot
          (pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>
           *__return_storage_ptr__,Algorithms *this,BigInteger *p,BigInteger *n)

{
  bool bVar1;
  int iVar2;
  BigInteger local_4d0;
  BigInteger local_4b0;
  BigInteger local_490;
  BigInteger local_470;
  BigInteger local_450;
  undefined1 local_430 [8];
  BigInteger x2;
  undefined1 local_3f0 [8];
  BigInteger x1;
  BigInteger local_3b0;
  BigInteger local_390;
  BigInteger local_370;
  BigInteger local_350;
  BigInteger local_330;
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> local_310;
  undefined1 local_2d0 [8];
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> res;
  undefined1 local_288 [8];
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> w;
  BigInteger local_240;
  BigInteger local_220;
  BigInteger local_200;
  BigInteger local_1e0;
  BigInteger local_1c0;
  BigInteger local_1a0;
  BigInteger local_180;
  BigInteger local_160;
  BigInteger local_140;
  BigInteger local_120;
  BigInteger local_100;
  int local_dc;
  undefined1 local_d8 [4];
  int i;
  BigInteger a;
  BigInteger local_98;
  BigInteger local_68;
  BigInteger local_48;
  BigInteger *local_28;
  BigInteger *n_local;
  BigInteger *p_local;
  Algorithms *this_local;
  
  local_28 = n;
  n_local = p;
  p_local = (BigInteger *)this;
  this_local = (Algorithms *)__return_storage_ptr__;
  BigIntegerLibrary::BigInteger::BigInteger(&local_48,n);
  BigIntegerLibrary::BigInteger::BigInteger(&local_68,p);
  iVar2 = legendreSymbol(this,&local_48,&local_68);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_68);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_48);
  if (iVar2 == -1) {
    BigIntegerLibrary::BigInteger::BigInteger(&local_98,-1);
    BigIntegerLibrary::BigInteger::BigInteger((BigInteger *)&a.isNegative,-1);
    std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
    pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_true>
              (__return_storage_ptr__,&local_98,(BigInteger *)&a.isNegative);
    BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)&a.isNegative);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_98);
    return __return_storage_ptr__;
  }
  BigIntegerLibrary::BigInteger::BigInteger((BigInteger *)local_d8);
  for (local_dc = 0; local_dc < 100; local_dc = local_dc + 1) {
    BigIntegerLibrary::BigInteger::BigInteger(&local_120,1);
    BigIntegerLibrary::BigInteger::operator-(&local_140,p,1);
    random((Algorithms *)&local_100);
    BigIntegerLibrary::BigInteger::operator=((BigInteger *)local_d8,&local_100);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_100);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_140);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_120);
    BigIntegerLibrary::BigInteger::operator*
              (&local_180,(BigInteger *)local_d8,(BigInteger *)local_d8);
    BigIntegerLibrary::BigInteger::operator-(&local_160,&local_180,n);
    BigIntegerLibrary::BigInteger::BigInteger(&local_1a0,p);
    iVar2 = legendreSymbol(this,&local_160,&local_1a0);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_1a0);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_160);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_180);
    if (iVar2 == -1) break;
  }
  BigIntegerLibrary::BigInteger::operator*(&local_1e0,(BigInteger *)local_d8,(BigInteger *)local_d8)
  ;
  BigIntegerLibrary::BigInteger::operator-(&local_1c0,&local_1e0,n);
  BigIntegerLibrary::BigInteger::BigInteger(&local_200,p);
  iVar2 = legendreSymbol(this,&local_1c0,&local_200);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_200);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_1c0);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_1e0);
  if (iVar2 != -1) {
    BigIntegerLibrary::BigInteger::BigInteger(&local_220,-1);
    BigIntegerLibrary::BigInteger::BigInteger(&local_240,-1);
    std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
    pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_true>
              (__return_storage_ptr__,&local_220,&local_240);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_240);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_220);
    w.second._28_4_ = 1;
    goto LAB_0010df22;
  }
  res.second._28_4_ = 1;
  std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
  pair<BigIntegerLibrary::BigInteger_&,_int,_true>
            ((pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> *)local_288,
             (BigInteger *)local_d8,(int *)&res.second.field_0x1c);
  std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::pair
            (&local_310,
             (pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> *)local_288);
  BigIntegerLibrary::BigInteger::operator+(&local_350,p,1);
  BigIntegerLibrary::BigInteger::operator/(&local_330,&local_350,2);
  BigIntegerLibrary::BigInteger::BigInteger(&local_370,p);
  BigIntegerLibrary::BigInteger::operator*(&local_3b0,(BigInteger *)local_d8,(BigInteger *)local_d8)
  ;
  BigIntegerLibrary::BigInteger::operator-(&local_390,&local_3b0,n);
  powComplexMod((pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> *)local_2d0,this
                ,&local_310,&local_330,&local_370,&local_390);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_390);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_3b0);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_370);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_330);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_350);
  std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::~pair(&local_310);
  BigIntegerLibrary::BigInteger::BigInteger((BigInteger *)&x1.isNegative,0);
  bVar1 = BigIntegerLibrary::BigInteger::operator==
                    ((BigInteger *)&res.first.isNegative,(BigInteger *)&x1.isNegative);
  BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)&x1.isNegative);
  if (bVar1) {
    BigIntegerLibrary::BigInteger::BigInteger((BigInteger *)local_3f0,(BigInteger *)local_2d0);
    while( true ) {
      BigIntegerLibrary::BigInteger::BigInteger((BigInteger *)&x2.isNegative,0);
      bVar1 = BigIntegerLibrary::BigInteger::operator<
                        ((BigInteger *)local_3f0,(BigInteger *)&x2.isNegative);
      BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)&x2.isNegative);
      if (!bVar1) break;
      BigIntegerLibrary::BigInteger::operator+=((BigInteger *)local_3f0,p);
    }
    BigIntegerLibrary::BigInteger::operator-(&local_450,p,(BigInteger *)local_3f0);
    BigIntegerLibrary::BigInteger::operator%((BigInteger *)local_430,&local_450,p);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_450);
    BigIntegerLibrary::BigInteger::operator*
              (&local_490,(BigInteger *)local_3f0,(BigInteger *)local_3f0);
    BigIntegerLibrary::BigInteger::operator%(&local_470,&local_490,p);
    bVar1 = BigIntegerLibrary::BigInteger::operator==(&local_470,n);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_470);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_490);
    if (bVar1) {
      std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
      pair<BigIntegerLibrary::BigInteger_&,_BigIntegerLibrary::BigInteger_&,_true>
                (__return_storage_ptr__,(BigInteger *)local_3f0,(BigInteger *)local_430);
    }
    w.second._29_3_ = 0;
    w.second._28_1_ = bVar1;
    BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)local_430);
    BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)local_3f0);
    if (w.second._28_4_ == 0) goto LAB_0010de50;
  }
  else {
LAB_0010de50:
    BigIntegerLibrary::BigInteger::BigInteger(&local_4b0,-1);
    BigIntegerLibrary::BigInteger::BigInteger(&local_4d0,-1);
    std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
    pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_true>
              (__return_storage_ptr__,&local_4b0,&local_4d0);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_4d0);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_4b0);
    w.second._28_4_ = 1;
  }
  std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::~pair
            ((pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> *)local_2d0);
  std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::~pair
            ((pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> *)local_288);
LAB_0010df22:
  BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

pair<BigInteger, BigInteger> Algorithms::discreteSquareRoot(BigInteger p, BigInteger n) {
    if(legendreSymbol(n, p) == -1) {
        return {BigInteger(-1), BigInteger(-1)};
    }
    BigInteger a;
    for(int i = 0; i < 100; ++i) {
        a = random(1, p - 1);
        if(legendreSymbol(a * a - n, p) == -1) {
            break;
        }
    }
    if(legendreSymbol(a * a - n, p) != -1) {
        return {BigInteger(-1), BigInteger(-1)};
    }

    pair<BigInteger, BigInteger> w{a, 1};
    auto res = powComplexMod(w, (p + 1) / 2, p, a * a - n);
    if(res.second == BigInteger(0)) {
        BigInteger x1 = res.first;
        while (x1 < 0) {
            x1 += p;
        }
        BigInteger x2 = (p - x1) % p;
        if (x1 * x1 % p == n) {
            return {x1, x2};
        }
    }
    return {BigInteger(-1), BigInteger(-1)};

}